

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBackwardCompatibility.cpp
# Opt level: O0

void anon_unknown.dwarf_2d24c::diffImageFiles(char *fn1,char *fn2)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  BaseExc *pBVar4;
  stringstream _iex_throw_s_2;
  string e;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  ifstream i2;
  ifstream i1;
  char *in_stack_fffffffffffff438;
  basic_ifstream<char,_std::char_traits<char>_> *in_stack_fffffffffffff440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff484;
  byte local_b72;
  stringstream local_af0 [16];
  ostream local_ae0 [383];
  allocator<char> local_961;
  string local_960 [39];
  allocator<char> local_939;
  string local_938 [39];
  allocator<char> local_911;
  string local_910 [39];
  undefined1 local_8e9 [40];
  undefined1 local_8c1 [33];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [39];
  allocator<char> local_819;
  string local_818 [39];
  allocator<char> local_7f1;
  string local_7f0 [32];
  string local_7d0 [32];
  stringstream local_7b0 [16];
  ostream local_7a0 [383];
  allocator<char> local_621;
  string local_620 [39];
  allocator<char> local_5f9;
  string local_5f8 [32];
  string local_5d8 [32];
  stringstream local_5b8 [16];
  ostream local_5a8 [392];
  undefined1 local_420 [520];
  undefined1 local_218 [536];
  
  std::ifstream::ifstream(local_218);
  std::ifstream::ifstream(local_420);
  std::operator|(_S_in,_S_bin);
  testutil::OpenStreamWithUTF8Name<std::ifstream>
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,
             ~(_S_ios_openmode_min|_S_ios_openmode_max));
  std::operator|(_S_in,_S_bin);
  testutil::OpenStreamWithUTF8Name<std::ifstream>
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,
             ~(_S_ios_openmode_min|_S_ios_openmode_max));
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_5b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
               (char *)in_stack_fffffffffffff478,(allocator<char> *)in_stack_fffffffffffff470);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
               (char *)in_stack_fffffffffffff478,(allocator<char> *)in_stack_fffffffffffff470);
    std::operator+(in_stack_fffffffffffff478,in_stack_fffffffffffff470);
    std::operator<<(local_5a8,local_5d8);
    std::__cxx11::string::~string(local_5d8);
    std::__cxx11::string::~string(local_620);
    std::allocator<char>::~allocator(&local_621);
    std::__cxx11::string::~string(local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    pBVar4 = (BaseExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::BaseExc::BaseExc(pBVar4,local_5b8);
    __cxa_throw(pBVar4,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
  }
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    while( true ) {
      bVar1 = std::ios::eof();
      local_b72 = 0;
      if ((bVar1 & 1) == 0) {
        local_b72 = std::ios::eof();
        local_b72 = local_b72 ^ 0xff;
      }
      if ((local_b72 & 1) == 0) break;
      iVar2 = std::istream::get();
      iVar3 = std::istream::get();
      if (iVar2 != iVar3) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar3,in_stack_fffffffffffff480),(char *)__lhs,
                   (allocator<char> *)in_stack_fffffffffffff470);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar3,in_stack_fffffffffffff480),(char *)__lhs,(allocator<char> *)__rhs)
        ;
        std::operator+(__lhs,__rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar3,in_stack_fffffffffffff480),(char *)__lhs,(allocator<char> *)__rhs)
        ;
        std::operator+(__lhs,__rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar3,in_stack_fffffffffffff480),(char *)__lhs,(allocator<char> *)__rhs)
        ;
        std::operator+(__lhs,__rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar3,in_stack_fffffffffffff480),(char *)__lhs,(allocator<char> *)__rhs)
        ;
        std::operator+(__lhs,__rhs);
        std::__cxx11::string::~string(local_960);
        std::allocator<char>::~allocator(&local_961);
        std::__cxx11::string::~string(local_860);
        std::__cxx11::string::~string(local_938);
        std::allocator<char>::~allocator(&local_939);
        std::__cxx11::string::~string(local_880);
        std::__cxx11::string::~string(local_910);
        std::allocator<char>::~allocator(&local_911);
        std::__cxx11::string::~string(local_8a0);
        std::__cxx11::string::~string((string *)(local_8e9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_8e9);
        std::__cxx11::string::~string((string *)(local_8c1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_8c1);
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_af0);
        std::operator<<(local_ae0,local_840);
        pBVar4 = (BaseExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::BaseExc::BaseExc(pBVar4,local_af0);
        __cxa_throw(pBVar4,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
      }
    }
    std::ifstream::~ifstream(local_420);
    std::ifstream::~ifstream(local_218);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
             (char *)in_stack_fffffffffffff478,(allocator<char> *)in_stack_fffffffffffff470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
             (char *)in_stack_fffffffffffff478,(allocator<char> *)in_stack_fffffffffffff470);
  std::operator+(in_stack_fffffffffffff478,in_stack_fffffffffffff470);
  std::operator<<(local_7a0,local_7d0);
  std::__cxx11::string::~string(local_7d0);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator(&local_819);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator(&local_7f1);
  pBVar4 = (BaseExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::BaseExc::BaseExc(pBVar4,local_7b0);
  __cxa_throw(pBVar4,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
}

Assistant:

void
diffImageFiles (const char* fn1, const char* fn2)
{
    ifstream i1, i2;
    testutil::OpenStreamWithUTF8Name (i1, fn1, ios::in | ios::binary);
    testutil::OpenStreamWithUTF8Name (i2, fn2, ios::in | ios::binary);

    if (!i1.good ())
    {
        THROW (IEX_NAMESPACE::BaseExc, string ("cannot open ") + string (fn1));
    }
    if (!i2.good ())
    {
        THROW (IEX_NAMESPACE::BaseExc, string ("cannot open ") + string (fn2));
    }

    while (!i1.eof () && !i2.eof ())
    {
        if (i1.get () != i2.get ())
        {
            string e = string ("v1.7 and current differences between '") +
                       string (fn1) + string ("' & '") + string (fn2) +
                       string ("'");
            THROW (IEX_NAMESPACE::BaseExc, e);
        }
    }
}